

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson.c
# Opt level: O0

_Bool bson_append_maxkey(bson_t *bson,char *key,int key_length)

{
  _Bool _Var1;
  size_t sVar2;
  uint local_1c;
  int key_length_local;
  char *key_local;
  bson_t *bson_local;
  
  if (bson == (bson_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson.c",
            0x598,"bson_append_maxkey","bson");
    abort();
  }
  if (key == (char *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson.c",
            0x599,"bson_append_maxkey","key");
    abort();
  }
  local_1c = key_length;
  if (key_length < 0) {
    sVar2 = strlen(key);
    local_1c = (uint)sVar2;
  }
  _Var1 = _bson_append(bson,3,local_1c + 2,1,&bson_append_maxkey::type,(ulong)local_1c,key,1,"");
  return _Var1;
}

Assistant:

bool
bson_append_maxkey (bson_t *bson, const char *key, int key_length)
{
   static const uint8_t type = BSON_TYPE_MAXKEY;

   BSON_ASSERT (bson);
   BSON_ASSERT (key);

   if (key_length < 0) {
      key_length = (int) strlen (key);
   }

   return _bson_append (
      bson, 3, (1 + key_length + 1), 1, &type, key_length, key, 1, &gZero);
}